

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbDec6.c
# Opt level: O3

int Rsb_DecInitCexes(int nVars,word *f,word **g,int nGs,int nGsAll,word *pCexes,Vec_Int_t *vTries)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int nWords;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  word *pwVar18;
  bool bVar19;
  
  uVar9 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar9 = 1;
  }
  uVar10 = (ulong)uVar9;
  iVar5 = uVar9 * 0x40;
  iVar6 = iVar5 + -1;
  iVar7 = 0;
  if (((*f & 1) == 0) && (iVar7 = -1, 0 < (int)uVar9)) {
    lVar16 = 0;
    pwVar18 = f;
    do {
      uVar17 = *pwVar18;
      if (uVar17 != 0) {
        bVar19 = (int)uVar17 == 0;
        uVar14 = uVar17 >> 0x20;
        if (!bVar19) {
          uVar14 = uVar17;
        }
        iVar15 = (uint)bVar19 * 0x20;
        iVar7 = iVar15 + 0x10;
        uVar17 = uVar14 >> 0x10;
        if ((short)uVar14 != 0) {
          iVar7 = iVar15;
          uVar17 = uVar14;
        }
        iVar15 = iVar7 + 8;
        uVar14 = uVar17 >> 8;
        if ((char)uVar17 != '\0') {
          iVar15 = iVar7;
          uVar14 = uVar17;
        }
        iVar7 = iVar15 + 4;
        uVar17 = uVar14 >> 4;
        if ((uVar14 & 0xf) != 0) {
          iVar7 = iVar15;
          uVar17 = uVar14;
        }
        uVar13 = (uint)(uVar17 >> 2) & 0x3fffffff;
        iVar15 = iVar7 + 2;
        if ((uVar17 & 3) != 0) {
          uVar13 = (uint)uVar17;
          iVar15 = iVar7;
        }
        iVar7 = ((~uVar13 & 1) + iVar15) - (int)lVar16;
        break;
      }
      lVar16 = lVar16 + -0x40;
      pwVar18 = pwVar18 + 1;
    } while (uVar10 * 0x40 + lVar16 != 0);
  }
  iVar15 = iVar6;
  if (-1 < (long)f[iVar6 >> 6]) {
    iVar15 = iVar5 + 0x3f;
    uVar17 = uVar10;
    do {
      if ((int)uVar17 < 1) {
        iVar15 = -1;
        goto LAB_0054c882;
      }
      uVar14 = f[uVar17 - 1];
      uVar17 = uVar17 - 1;
      iVar15 = iVar15 + -0x40;
    } while (uVar14 == 0);
    bVar19 = uVar14 >> 0x20 == 0;
    uVar17 = uVar14 << 0x20;
    if (!bVar19) {
      uVar17 = uVar14;
    }
    iVar11 = (uint)bVar19 * 0x20;
    iVar8 = iVar11 + 0x10;
    uVar14 = uVar17 << 0x10;
    if (uVar17 >> 0x30 != 0) {
      iVar8 = iVar11;
      uVar14 = uVar17;
    }
    iVar11 = iVar8 + 8;
    uVar17 = uVar14 << 8;
    if (uVar14 >> 0x38 != 0) {
      iVar11 = iVar8;
      uVar17 = uVar14;
    }
    iVar8 = iVar11 + 4;
    uVar14 = uVar17 << 4;
    if (uVar17 >> 0x3c != 0) {
      iVar8 = iVar11;
      uVar14 = uVar17;
    }
    bVar19 = uVar14 >> 0x3e != 0;
    uVar17 = uVar14 * 4;
    if (bVar19) {
      uVar17 = uVar14;
    }
    iVar11 = iVar8 + 2;
    if (bVar19) {
      iVar11 = iVar8;
    }
    iVar15 = iVar15 - ((uint)(-1 < (long)uVar17) + iVar11);
  }
LAB_0054c882:
  iVar8 = 0;
  if (((*f & 1) != 0) && (iVar8 = -1, 0 < (int)uVar9)) {
    lVar16 = 0;
    pwVar18 = f;
    do {
      uVar17 = *pwVar18;
      if (uVar17 != 0xffffffffffffffff) {
        bVar19 = (int)uVar17 == -1;
        uVar14 = ~uVar17 >> 0x20;
        if (!bVar19) {
          uVar14 = ~uVar17;
        }
        iVar11 = (uint)bVar19 * 0x20;
        iVar8 = iVar11 + 0x10;
        uVar17 = uVar14 >> 0x10;
        if ((short)uVar14 != 0) {
          iVar8 = iVar11;
          uVar17 = uVar14;
        }
        iVar11 = iVar8 + 8;
        uVar14 = uVar17 >> 8;
        if ((char)uVar17 != '\0') {
          iVar11 = iVar8;
          uVar14 = uVar17;
        }
        iVar8 = iVar11 + 4;
        uVar17 = uVar14 >> 4;
        if ((uVar14 & 0xf) != 0) {
          iVar8 = iVar11;
          uVar17 = uVar14;
        }
        uVar9 = (uint)(uVar17 >> 2) & 0x3fffffff;
        iVar11 = iVar8 + 2;
        if ((uVar17 & 3) != 0) {
          uVar9 = (uint)uVar17;
          iVar11 = iVar8;
        }
        iVar8 = ((~uVar9 & 1) + iVar11) - (int)lVar16;
        break;
      }
      lVar16 = lVar16 + -0x40;
      pwVar18 = pwVar18 + 1;
    } while (uVar10 * 0x40 + lVar16 != 0);
  }
  if ((long)f[iVar6 >> 6] < 0) {
    iVar5 = iVar5 + 0x3f;
    do {
      if ((int)uVar10 < 1) {
        iVar6 = -1;
        goto LAB_0054ca2c;
      }
      uVar17 = f[uVar10 - 1];
      uVar10 = uVar10 - 1;
      iVar5 = iVar5 + -0x40;
    } while (uVar17 == 0xffffffffffffffff);
    uVar10 = ~uVar17 << 0x20;
    if (uVar17 < 0xffffffff00000000) {
      uVar10 = ~uVar17;
    }
    iVar11 = (uint)(0xfffffffeffffffff < uVar17) * 0x20;
    iVar6 = iVar11 + 0x10;
    uVar17 = uVar10 << 0x10;
    if (uVar10 >> 0x30 != 0) {
      iVar6 = iVar11;
      uVar17 = uVar10;
    }
    iVar11 = iVar6 + 8;
    uVar10 = uVar17 << 8;
    if (uVar17 >> 0x38 != 0) {
      iVar11 = iVar6;
      uVar10 = uVar17;
    }
    iVar6 = iVar11 + 4;
    uVar17 = uVar10 << 4;
    if (uVar10 >> 0x3c != 0) {
      iVar6 = iVar11;
      uVar17 = uVar10;
    }
    iVar11 = iVar6 + 2;
    uVar10 = uVar17 * 4;
    if (uVar17 >> 0x3e != 0) {
      iVar11 = iVar6;
      uVar10 = uVar17;
    }
    iVar6 = iVar5 - ((uint)(-1 < (long)uVar10) + iVar11);
  }
LAB_0054ca2c:
  iVar5 = iVar7 >> 6;
  bVar1 = (byte)iVar7 & 0x3f;
  iVar7 = iVar8 >> 6;
  bVar2 = (byte)iVar8 & 0x3f;
  uVar9 = (uint)(f[iVar7] >> bVar2);
  uVar13 = (uint)(f[iVar5] >> bVar1);
  if (((uVar9 ^ uVar13) & 1) == 0) {
    __assert_fail("!Rsb_DecTryCex( f, iCexT0, iCexF0 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/rsb/rsbDec6.c"
                  ,0x131,"int Rsb_DecInitCexes(int, word *, word **, int, int, word *, Vec_Int_t *)"
                 );
  }
  iVar8 = iVar6 >> 6;
  bVar3 = (byte)iVar6 & 0x3f;
  uVar12 = (uint)(f[iVar8] >> bVar3);
  if (((uVar13 ^ uVar12) & 1) == 0) {
    __assert_fail("!Rsb_DecTryCex( f, iCexT0, iCexF1 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/rsb/rsbDec6.c"
                  ,0x132,"int Rsb_DecInitCexes(int, word *, word **, int, int, word *, Vec_Int_t *)"
                 );
  }
  iVar6 = iVar15 >> 6;
  bVar4 = (byte)iVar15 & 0x3f;
  uVar13 = (uint)(f[iVar6] >> bVar4);
  if (((uVar9 ^ uVar13) & 1) == 0) {
    __assert_fail("!Rsb_DecTryCex( f, iCexT1, iCexF0 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/rsb/rsbDec6.c"
                  ,0x133,"int Rsb_DecInitCexes(int, word *, word **, int, int, word *, Vec_Int_t *)"
                 );
  }
  if (((uVar13 ^ uVar12) & 1) != 0) {
    if (0 < nGsAll) {
      uVar10 = (ulong)(uint)nGsAll;
      uVar17 = 0;
      do {
        if ((((uint)(g[uVar17][iVar7] >> bVar2) ^ (uint)(g[uVar17][iVar5] >> bVar1)) & 1) == 0) {
          *(byte *)(pCexes + uVar17) = (byte)pCexes[uVar17] | 1;
        }
        uVar17 = uVar17 + 1;
      } while (uVar10 != uVar17);
      uVar17 = 0;
      do {
        if ((((uint)(g[uVar17][iVar8] >> bVar3) ^ (uint)(g[uVar17][iVar5] >> bVar1)) & 1) == 0) {
          *(byte *)(pCexes + uVar17) = (byte)pCexes[uVar17] | 2;
        }
        uVar17 = uVar17 + 1;
      } while (uVar10 != uVar17);
      uVar17 = 0;
      do {
        if ((((uint)(g[uVar17][iVar7] >> bVar2) ^ (uint)(g[uVar17][iVar6] >> bVar4)) & 1) == 0) {
          *(byte *)(pCexes + uVar17) = (byte)pCexes[uVar17] | 4;
        }
        uVar17 = uVar17 + 1;
      } while (uVar10 != uVar17);
      uVar17 = 0;
      do {
        if ((((uint)(g[uVar17][iVar8] >> bVar3) ^ (uint)(g[uVar17][iVar6] >> bVar4)) & 1) == 0) {
          *(byte *)(pCexes + uVar17) = (byte)pCexes[uVar17] | 8;
        }
        uVar17 = uVar17 + 1;
      } while (uVar10 != uVar17);
    }
    if (vTries != (Vec_Int_t *)0x0) {
      Vec_IntPush(vTries,-1);
      Vec_IntPush(vTries,-1);
      Vec_IntPush(vTries,-1);
      Vec_IntPush(vTries,-1);
    }
    return 4;
  }
  __assert_fail("!Rsb_DecTryCex( f, iCexT1, iCexF1 )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/rsb/rsbDec6.c"
                ,0x134,"int Rsb_DecInitCexes(int, word *, word **, int, int, word *, Vec_Int_t *)");
}

Assistant:

int Rsb_DecInitCexes( int nVars, word * f, word ** g, int nGs, int nGsAll, word * pCexes, Vec_Int_t * vTries ) 
{
    int nWords = Abc_TtWordNum( nVars );
    int ValueB = Abc_TtGetBit( f, 0 );
    int ValueE = Abc_TtGetBit( f, 64*nWords-1 );
    int iCexT0, iCexT1, iCexF0, iCexF1;

    iCexT0 = ValueB  ? 0           : Abc_TtFindFirstBit( f, nVars );
    iCexT1 = ValueE  ? 64*nWords-1 : Abc_TtFindLastBit( f, nVars );

    iCexF0 = !ValueB ? 0           : Abc_TtFindFirstZero( f, nVars );
    iCexF1 = !ValueE ? 64*nWords-1 : Abc_TtFindLastZero( f, nVars );

    assert( !Rsb_DecTryCex( f, iCexT0, iCexF0 ) );
    assert( !Rsb_DecTryCex( f, iCexT0, iCexF1 ) );
    assert( !Rsb_DecTryCex( f, iCexT1, iCexF0 ) );
    assert( !Rsb_DecTryCex( f, iCexT1, iCexF1 ) );

    Rsb_DecRecordCex( g, nGsAll, iCexT0, iCexF0, pCexes, 0 );
    Rsb_DecRecordCex( g, nGsAll, iCexT0, iCexF1, pCexes, 1 );
    Rsb_DecRecordCex( g, nGsAll, iCexT1, iCexF0, pCexes, 2 );
    Rsb_DecRecordCex( g, nGsAll, iCexT1, iCexF1, pCexes, 3 );

    if ( vTries )
    {
    Vec_IntPush( vTries, -1 );
    Vec_IntPush( vTries, -1 );
    Vec_IntPush( vTries, -1 );
    Vec_IntPush( vTries, -1 );
    }
    return 4;
}